

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v10::detail::
for_each_codepoint<fmt::v10::detail::compute_width(fmt::v10::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  size_t sVar1;
  char *pcVar2;
  char *end_1;
  char *buf_ptr;
  char *pcStack_48;
  char buf [7];
  long num_chars_left;
  char *end;
  size_t block_size;
  char *p;
  anon_class_8_1_54a39806 decode;
  count_code_points f_local;
  string_view s_local;
  
  p = (char *)s.size_;
  decode.f.count = (count_code_points)(count_code_points)p;
  f_local.count = (size_t *)this;
  block_size = (size_t)basic_string_view<char>::data((basic_string_view<char> *)&f_local);
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&f_local);
  if (sVar1 < 4) {
LAB_003ee576:
    pcVar2 = basic_string_view<char>::data((basic_string_view<char> *)&f_local);
    sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&f_local);
    pcStack_48 = pcVar2 + (sVar1 - block_size);
    if (pcStack_48 != (char *)0x0) {
      memset((void *)((long)&buf_ptr + 1),0,7);
      copy_str<char,_const_char,_char,_0>
                ((char *)block_size,pcStack_48 + block_size,(char *)((long)&buf_ptr + 1));
      end_1 = (char *)((long)&buf_ptr + 1);
      do {
        pcVar2 = for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                           ((anon_class_8_1_54a39806 *)&p,end_1,(char *)block_size);
        if (pcVar2 == (char *)0x0) {
          return;
        }
        block_size = (size_t)(pcVar2 + (block_size - (long)end_1));
        end_1 = pcVar2;
      } while ((long)pcVar2 - ((long)&buf_ptr + 1) < (long)pcStack_48);
    }
  }
  else {
    sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&f_local);
    pcVar2 = (char *)(block_size + (sVar1 - 3));
    do {
      if (pcVar2 <= block_size) goto LAB_003ee576;
      block_size = (size_t)for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::
                           operator()((anon_class_8_1_54a39806 *)&p,(char *)block_size,
                                      (char *)block_size);
    } while ((char *)block_size != (char *)0x0);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, error ? 1 : to_unsigned(end - buf_ptr)));
    return result ? (error ? buf_ptr + 1 : end) : nullptr;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    const char* buf_ptr = buf;
    do {
      auto end = decode(buf_ptr, p);
      if (!end) return;
      p += end - buf_ptr;
      buf_ptr = end;
    } while (buf_ptr - buf < num_chars_left);
  }
}